

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O1

int main(void)

{
  uint *puVar1;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  char dirbuffer [1024];
  char acStack_428 [95];
  char local_3c9 [937];
  
  puVar1 = (uint *)cpuid_Version_info(1);
  uVar4 = (ulong)puVar1[3];
  uVar3 = *puVar1 >> 4;
  if (uVar3 < 0x406c) {
    if (uVar3 < 0x2065) {
      if (uVar3 < 0x266) {
        if (uVar3 < 0x6d) {
          uVar4 = (ulong)(uVar3 - 99);
          if (uVar3 - 99 < 2) {
            pcVar6 = "Prescott";
            goto LAB_00104b46;
          }
          if (uVar3 == 0x66) {
            pcVar6 = "Presler";
            goto LAB_00104b46;
          }
        }
        else {
          if (uVar3 == 0x6d) {
            pcVar6 = "Dothan";
            goto LAB_00104b46;
          }
          if (uVar3 == 0x6f) goto switchD_001048f3_caseD_0;
          if (uVar3 == 0x16c) {
            pcVar6 = "Pineview";
            goto LAB_00104b46;
          }
        }
      }
      else {
        uVar5 = (ulong)(uVar3 - 0x1066);
        if (uVar3 - 0x1066 < 9) {
          uVar4 = (long)&switchD_001048f3::switchdataD_00128004 +
                  (long)(int)(&switchD_001048f3::switchdataD_00128004)[uVar5];
          switch(uVar5) {
          case 0:
switchD_001048f3_caseD_0:
            pcVar6 = "Merom";
            goto LAB_00104b46;
          case 1:
          case 7:
            pcVar6 = "Penryn";
            goto LAB_00104b46;
          case 4:
          case 8:
switchD_001048f3_caseD_4:
            pcVar6 = "Nehalem";
            goto LAB_00104b46;
          }
        }
        else {
          uVar4 = uVar5;
          if (uVar3 == 0x266) {
            pcVar6 = "Lincroft";
            goto LAB_00104b46;
          }
          if (uVar3 == 0x366) {
            pcVar6 = "Cedarview";
            goto LAB_00104b46;
          }
        }
      }
    }
    else if (uVar3 < 0x306a) {
      uVar3 = uVar3 - 0x2065;
      if (uVar3 < 0xb) {
        uVar4 = 0x481;
        if ((0x481U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar6 = "Westmere";
          goto LAB_00104b46;
        }
        uVar4 = 0x120;
        if ((0x120U >> (uVar3 & 0x1f) & 1) != 0) {
          pcVar6 = "SandyBridge";
          goto LAB_00104b46;
        }
        if (uVar3 == 9) goto switchD_001048f3_caseD_4;
      }
    }
    else if (uVar3 < 0x306d) {
      if (uVar3 == 0x306a) {
        pcVar6 = "IvyBridge";
        goto LAB_00104b46;
      }
      if (uVar3 == 0x306c) {
        pcVar6 = "Haswell";
        goto LAB_00104b46;
      }
    }
    else {
      if (uVar3 == 0x306d) {
        pcVar6 = "Broadwell";
        goto LAB_00104b46;
      }
      if (uVar3 == 0x30f1) goto LAB_00104ad9;
    }
  }
  else if (uVar3 < 0x9067) {
    if (uVar3 < 0x706a) {
      if (uVar3 < 0x606a) {
        if (uVar3 == 0x406c) {
          pcVar6 = "CherryTrail";
          goto LAB_00104b46;
        }
        if (uVar3 == 0x506c) goto LAB_00104a79;
        if (uVar3 == 0x506e) {
          pcVar6 = "Skylake";
          goto LAB_00104b46;
        }
      }
      else {
        if (uVar3 == 0x606a) {
LAB_00104a85:
          pcVar6 = "Icelake";
          goto LAB_00104b46;
        }
        if ((uVar3 == 0x60f0) || (uVar3 == 0x60f8)) {
LAB_00104ad9:
          pcVar6 = "Zen2";
          goto LAB_00104b46;
        }
      }
    }
    else if (uVar3 < 0x806c) {
      if (uVar3 == 0x706a) {
LAB_00104a79:
        pcVar6 = "Goldmont";
        goto LAB_00104b46;
      }
      if (uVar3 == 0x706e) goto LAB_00104a85;
      if (uVar3 == 0x70f1) goto LAB_00104ad9;
    }
    else {
      uVar4 = (ulong)(uVar3 - 0x806c);
      if (uVar3 - 0x806c < 2) {
        pcVar6 = "TigerLake";
        goto LAB_00104b46;
      }
      if (uVar3 == 0x806e) {
LAB_00104ae9:
        pcVar6 = "Kabylake";
        goto LAB_00104b46;
      }
    }
  }
  else if (uVar3 < 0xa067) {
    if (uVar3 < 0x90f0) {
      if ((uVar3 == 0x9067) || (uVar3 == 0x906a)) {
        pcVar6 = "Alderlake";
        goto LAB_00104b46;
      }
      if (uVar3 == 0x906e) goto LAB_00104ae9;
    }
    else {
      uVar4 = (ulong)(uVar3 - 0xa065);
      if (uVar3 - 0xa065 < 2) {
        pcVar6 = "Cometlake";
        goto LAB_00104b46;
      }
      if (uVar3 == 0x90f0) goto LAB_00104ad9;
    }
  }
  else if (uVar3 < 0x40f40) {
    if (uVar3 == 0xa067) {
      pcVar6 = "Rocketlake";
      goto LAB_00104b46;
    }
    if (uVar3 == 0xb067) {
      pcVar6 = "Raptorlake";
      goto LAB_00104b46;
    }
    if (uVar3 == 0x20f10) goto LAB_00104a91;
  }
  else {
    if (uVar3 == 0x40f40) {
      pcVar6 = "Zen3+";
      goto LAB_00104b46;
    }
    if (uVar3 == 0x50f00) {
LAB_00104a91:
      pcVar6 = "Zen3";
      goto LAB_00104b46;
    }
    if (uVar3 == 0x60f10) {
      pcVar6 = "Zen4";
      goto LAB_00104b46;
    }
  }
  pcVar6 = "unknown";
LAB_00104b46:
  printf("x64 processor:  %s\t",pcVar6,(ulong)puVar1[2],uVar4);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar7 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar7 + 0xc) != '@') {
    lVar7 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar7 + 0xc),(ulong)*(uint *)(lVar7 + 8),
           (ulong)*(uint *)(lVar7 + 0xc));
  }
  memcpy(acStack_428,
         "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/benchmarks/realdata/"
         ,0x60);
  lVar7 = 0;
  while( true ) {
    strcpy(local_3c9,*(char **)((long)datadir + lVar7));
    _Var2 = loadAndCheckAll(acStack_428,false);
    if ((!_Var2) || (_Var2 = loadAndCheckAll(acStack_428,true), !_Var2)) break;
    lVar7 = lVar7 + 8;
    if (lVar7 == 0x48) {
      return 0;
    }
  }
  puts("failure");
  return -1;
}

Assistant:

int main() {
    tellmeall();

    char dirbuffer[1024];
    size_t bddl = strlen(BENCHMARK_DATA_DIR);
    strcpy(dirbuffer, BENCHMARK_DATA_DIR);
    for (size_t i = 0; i < sizeof(datadir) / sizeof(const char *); i++) {
        strcpy(dirbuffer + bddl, datadir[i]);
        if (!loadAndCheckAll(dirbuffer, false)) {
            printf("failure\n");
            return -1;
        }
        if (!loadAndCheckAll(dirbuffer, true)) {
            printf("failure\n");
            return -1;
        }
    }

    return EXIT_SUCCESS;
}